

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O2

int AF_AActor_A_SkullPop
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  VMValue *pVVar1;
  player_t *ppVar2;
  bool bVar3;
  int iVar4;
  VMValue *pVVar5;
  PClass *p;
  PClassPlayerPawn *type;
  APlayerPawn *this;
  AActor *pAVar6;
  AActor *other;
  char *pcVar7;
  int i;
  long lVar8;
  AActor **obj;
  DVector3 local_48;
  
  if (numparam < 1) {
    pcVar7 = "(paramnum) < numparam";
    goto LAB_00467207;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_004671f7:
    pcVar7 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_00467207:
    __assert_fail(pcVar7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_user.cpp"
                  ,0x68d,
                  "int AF_AActor_A_SkullPop(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  other = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (other == (AActor *)0x0) goto LAB_00467034;
    bVar3 = DObject::IsKindOf((DObject *)other,AActor::RegistrationInfo.MyClass);
    if (!bVar3) {
      pcVar7 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_00467207;
    }
  }
  else {
    if (other != (AActor *)0x0) goto LAB_004671f7;
LAB_00467034:
    other = (AActor *)0x0;
  }
  if (numparam != 1) {
    if (param[1].field_0.field_3.Type == '\x03') {
      pVVar5 = param + 1;
      if (param[1].field_0.field_1.atag == 1) goto LAB_00467076;
      if ((pVVar5->field_0).field_1.a == (void *)0x0) goto LAB_0046709d;
    }
    pcVar7 = 
    "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
    ;
    goto LAB_00467226;
  }
  pVVar1 = defaultparam->Array;
  if (pVVar1[1].field_0.field_3.Type == '\x03') {
    pVVar5 = pVVar1 + 1;
    if (pVVar1[1].field_0.field_1.atag == 1) {
LAB_00467076:
      type = (PClassPlayerPawn *)(pVVar5->field_0).field_1.a;
      if ((type != (PClassPlayerPawn *)0x0) &&
         (bVar3 = PClass::IsAncestorOf(APlayerChunk::RegistrationInfo.MyClass,(PClass *)type), bVar3
         )) goto LAB_004670bd;
    }
    else if ((pVVar5->field_0).field_1.a != (void *)0x0) goto LAB_00467054;
LAB_0046709d:
    p = PClass::FindClass("BloodySkull");
    type = dyn_cast<PClassPlayerPawn>((DObject *)p);
    if (type == (PClassPlayerPawn *)0x0) {
      return 0;
    }
LAB_004670bd:
    *(byte *)&(other->flags).Value = (byte)(other->flags).Value & 0xfd;
    local_48.Z = (other->__Pos).Z + 48.0;
    local_48.X = (other->__Pos).X;
    local_48.Y = (other->__Pos).Y;
    this = (APlayerPawn *)Spawn(&type->super_PClassActor,&local_48,NO_REPLACE);
    iVar4 = FRandom::Random2(&pr_skullpop);
    ((DVector3 *)((DRotator *)(&(this->super_AActor).super_DThinker + 3) + 1))->X =
         (double)iVar4 * 0.0078125;
    iVar4 = FRandom::Random2(&pr_skullpop);
    ((DVector3 *)((DRotator *)(&(this->super_AActor).super_DThinker + 3) + 1))->Y =
         (double)iVar4 * 0.0078125;
    iVar4 = FRandom::operator()(&pr_skullpop);
    ((DVector3 *)((DRotator *)(&(this->super_AActor).super_DThinker + 3) + 1))->Z =
         (double)iVar4 * 0.0009765625 + 2.0;
    ppVar2 = other->player;
    other->player = (player_t *)0x0;
    AActor::ObtainInventory((AActor *)this,other);
    *(player_t **)(&(this->super_AActor).super_DThinker + 10) = ppVar2;
    (this->super_AActor).health = other->health;
    (this->super_AActor).Angles.Yaw.Degrees = (other->Angles).Yaw.Degrees;
    if (ppVar2 != (player_t *)0x0) {
      ppVar2->mo = this;
      ppVar2->damagecount = 0x20;
    }
    obj = (AActor **)&DAT_017dc0f8;
    for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
      if ((playeringame[lVar8] == true) && (pAVar6 = GC::ReadBarrier<AActor>(obj), pAVar6 == other))
      {
        *obj = (AActor *)this;
      }
      obj = obj + 0x54;
    }
    return 0;
  }
LAB_00467054:
  pcVar7 = 
  "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
  ;
LAB_00467226:
  __assert_fail(pcVar7,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_user.cpp"
                ,0x68e,
                "int AF_AActor_A_SkullPop(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SkullPop)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_CLASS_DEF(spawntype, APlayerChunk);

	APlayerPawn *mo;
	player_t *player;

	// [GRB] Parameterized version
	if (spawntype == NULL || !spawntype->IsDescendantOf(RUNTIME_CLASS(APlayerChunk)))
	{
		spawntype = dyn_cast<PClassPlayerPawn>(PClass::FindClass("BloodySkull"));
		if (spawntype == NULL)
			return 0;
	}

	self->flags &= ~MF_SOLID;
	mo = (APlayerPawn *)Spawn (spawntype, self->PosPlusZ(48.), NO_REPLACE);
	//mo->target = self;
	mo->Vel.X = pr_skullpop.Random2() / 128.;
	mo->Vel.Y = pr_skullpop.Random2() / 128.;
	mo->Vel.Z = 2. + (pr_skullpop() / 1024.);
	// Attach player mobj to bloody skull
	player = self->player;
	self->player = NULL;
	mo->ObtainInventory (self);
	mo->player = player;
	mo->health = self->health;
	mo->Angles.Yaw = self->Angles.Yaw;
	if (player != NULL)
	{
		player->mo = mo;
		player->damagecount = 32;
	}
	for (int i = 0; i < MAXPLAYERS; ++i)
	{
		if (playeringame[i] && players[i].camera == self)
		{
			players[i].camera = mo;
		}
	}
	return 0;
}